

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-dos.cc
# Opt level: O2

bool __thiscall DataSourceDOS::load(DataSourceDOS *this)

{
  PBuffer *this_00;
  int iVar1;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  allocator<char> local_d9;
  undefined1 local_d8 [16];
  PBuffer anim;
  __shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> local_98;
  string local_88 [64];
  string local_48 [32];
  
  iVar1 = (*(this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source[5])();
  if ((char)iVar1 == '\0') {
    bVar4 = false;
  }
  else {
    std::make_shared<Buffer,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&anim);
    this_00 = &this->spae;
    std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&this_00->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>,
               &anim.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&anim.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_98,&this_00->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>);
    UnpackerTPWM::UnpackerTPWM((UnpackerTPWM *)&anim,(PBuffer *)&local_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
    UnpackerTPWM::convert((UnpackerTPWM *)local_d8);
    std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&this_00->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> *)local_d8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8));
    std::__cxx11::string::string<std::allocator<char>>(local_48,"data",&local_d9);
    Log::Logger::operator[]((Logger *)local_d8,(string *)&Log::Verbose);
    Log::Stream::operator<<((Stream *)local_d8,"Data file is compressed");
    Log::Stream::~Stream((Stream *)local_d8);
    std::__cxx11::string::~string(local_48);
    Convertor::~Convertor((Convertor *)&anim);
    uVar2 = Buffer::pop<unsigned_int>
                      ((this->spae).super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    uVar3 = (ulong)uVar2;
    anim.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    anim.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::vector<DataSourceDOS::DataEntry,_std::allocator<DataSourceDOS::DataEntry>_>::
    emplace_back<DataSourceDOS::DataEntry>(&this->entries,(DataEntry *)&anim);
    while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
      uVar2 = Buffer::pop<unsigned_int>
                        ((this_00->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
      anim.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar2;
      uVar2 = Buffer::pop<unsigned_int>
                        ((this_00->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
      anim.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)(ulong)uVar2;
      std::vector<DataSourceDOS::DataEntry,_std::allocator<DataSourceDOS::DataEntry>_>::push_back
                (&this->entries,(DataEntry *)&anim);
    }
    fixup(this);
    get_object((DataSourceDOS *)&anim,(size_t)this);
    (anim.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->endianess = EndianessBig;
    uVar3 = (anim.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->size;
    uVar2 = Buffer::pop<unsigned_int>
                      (anim.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (uVar3 == uVar2) {
      Buffer::pop_tail((Buffer *)local_d8);
      std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&anim.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> *)local_d8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8));
      std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff58,
                 &anim.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>);
      bVar4 = DataSourceLegacy::load_animation_table
                        (&this->super_DataSourceLegacy,(PBuffer *)&stack0xffffffffffffff58);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff60);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>(local_88,"data",&local_d9);
      Log::Logger::operator[]((Logger *)local_d8,(string *)&Log::Error);
      Log::Stream::operator<<((Stream *)local_d8,"Could not extract animation table.");
      Log::Stream::~Stream((Stream *)local_d8);
      std::__cxx11::string::~string(local_88);
      bVar4 = false;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&anim.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return bVar4;
}

Assistant:

bool
DataSourceDOS::load() {
  if (!check()) {
    return false;
  }

  try {
    spae = std::make_shared<Buffer>(path);
  } catch (...) {
    return false;
  }

  // Check that data file is decompressed
  try {
    UnpackerTPWM unpacker(spae);
    spae = unpacker.convert();
    Log::Verbose["data"] << "Data file is compressed";
  }  catch (...) {
    Log::Verbose["data"] << "Data file is not compressed";
  }

  // Read the number of entries in the index table.
  // Some entries are undefined (size and offset are zero).
  size_t entry_count = spae->pop<uint32_t>();
  entries.push_back({0, 0});  // first entry is whole file itself, drop it
  for (size_t i = 0; i < entry_count; i++) {
    DataEntry entry;
    entry.size = spae->pop<uint32_t>();
    entry.offset = spae->pop<uint32_t>();
    entries.push_back(entry);
  }

  fixup();

  // The first uint32 is the byte length of the rest
  // of the table in big endian order.
  PBuffer anim = get_object(DATA_SERF_ANIMATION_TABLE);
  anim->set_endianess(Buffer::EndianessBig);
  size_t size = anim->get_size();
  if (size != anim->pop<uint32_t>()) {
    Log::Error["data"] << "Could not extract animation table.";
    return false;
  }
  anim = anim->pop_tail();

  return load_animation_table(anim);
}